

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O3

void device_init(char *cfg)

{
  embree::data = (RTCScene)0x0;
  _DAT_002cad78 = 0;
  _DAT_002cad80 = g_ispc_scene;
  _DAT_002cad90 = g_dirlight_direction.field_0._0_8_;
  uRam00000000002cad98 = g_dirlight_direction.field_0._8_8_;
  _DAT_002cada0 = g_dirlight_intensity.field_0._0_8_;
  uRam00000000002cada8 = g_dirlight_intensity.field_0._8_8_;
  _DAT_002cadb0 = g_ambient_intensity.field_0._0_8_;
  uRam00000000002cadb8 = g_ambient_intensity.field_0._8_8_;
  DAT_002cadc0 = 0;
  _DAT_002cadc8 = 0;
  _DAT_002cadd0 = 0;
  _DAT_002cade0 = 0;
  uRam00000000002cade8 = 0;
  _DAT_002cadf0 = 0;
  uRam00000000002cadf8 = 0;
  _DAT_002cae00 = 0;
  uRam00000000002cae08 = 0;
  _DAT_002cae10 = 0;
  uRam00000000002cae18 = 0;
  DAT_002cae20 = 0;
  _DAT_002cae30 = 0x3f11eb853f4ccccd;
  uRam00000000002cae38 = 0x3ea3d70a;
  _DAT_002cae40 = 0x3df5c28f3dcccccd;
  uRam00000000002cae48 = 0x3da3d70a;
  _DAT_002cae50 = 0x3de978d53e23d70b;
  uRam00000000002cae58 = 0x3d83126f;
  _DAT_002cae60 = 0x3ee978d53f23d70b;
  uRam00000000002cae68 = 0x3e83126f;
  embree::g_scene = embree::convertScene(g_ispc_scene);
  embree::data = embree::g_scene;
  _DAT_002cad78 = rtcGetSceneTraversable(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  g_scene = data.scene = convertScene(data.ispc_scene);
  data.traversable = rtcGetSceneTraversable(data.scene);
}